

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

vector<duckdb::DataPointer,_true> * __thiscall
duckdb::ColumnData::GetDataPointers
          (vector<duckdb::DataPointer,_true> *__return_storage_ptr__,ColumnData *this)

{
  __pointer_type this_00;
  SegmentIterator SVar1;
  SegmentIterationHelper local_a8;
  DataPointer local_a0;
  
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.tree = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>;
  SVar1 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::begin(&local_a8);
  for (this_00 = SVar1.current; this_00 != (ColumnSegment *)0x0;
      this_00 = (this_00->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
    ColumnSegment::GetDataPointer(&local_a0,this_00);
    ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
    emplace_back<duckdb::DataPointer>
              (&__return_storage_ptr__->
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,&local_a0);
    DataPointer::~DataPointer(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<DataPointer> ColumnData::GetDataPointers() {
	vector<DataPointer> pointers;
	for (auto &segment : data.Segments()) {
		pointers.push_back(segment.GetDataPointer());
	}
	return pointers;
}